

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_str(uchar *p,char *s,size_t l,char f,char *map)

{
  byte local_31;
  uchar c;
  char *map_local;
  size_t sStack_20;
  char f_local;
  size_t l_local;
  char *s_local;
  uchar *p_local;
  
  sStack_20 = l;
  l_local = (size_t)s;
  s_local = (char *)p;
  if (s == (char *)0x0) {
    l_local = (long)"user=%s\x01auth=Bearer %s\x01\x01" + 0x18;
  }
  while( true ) {
    local_31 = *(byte *)l_local;
    if (local_31 == 0 || sStack_20 == 0) break;
    if ((0x7f < local_31) || (map[local_31] == '\0')) {
      if ((local_31 < 0x61) || (0x7a < local_31)) {
        local_31 = 0x5f;
      }
      else {
        local_31 = local_31 - 0x20;
      }
    }
    *s_local = local_31;
    sStack_20 = sStack_20 - 1;
    l_local = l_local + 1;
    s_local = s_local + 1;
  }
  if (sStack_20 != 0) {
    memset(s_local,(uint)(byte)f,sStack_20);
  }
  return;
}

Assistant:

static void
set_str(unsigned char *p, const char *s, size_t l, char f, const char *map)
{
	unsigned char c;

	if (s == NULL)
		s = "";
	while ((c = *s++) != 0 && l > 0) {
		if (c >= 0x80 || map[c] == 0)
		 {
			/* illegal character */
			if (c >= 'a' && c <= 'z') {
				/* convert c from a-z to A-Z */
				c -= 0x20;
			} else
				c = 0x5f;
		}
		*p++ = c;
		l--;
	}
	/* If l isn't zero, fill p buffer by the character
	 * which indicated by f. */
	if (l > 0)
		memset(p , f, l);
}